

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::SetPropertyWithAttributes
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  Type TVar1;
  JavascriptLibrary *pJVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  int iVar6;
  PathTypeHandlerBase *pPVar7;
  SimpleTypeHandler<6UL> *pSVar8;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_68;
  Type *local_60;
  uint32 local_54;
  PropertyValueInfo *pPStack_50;
  uint32 indexVal;
  undefined4 *local_48;
  SimpleTypeHandler<6UL> *local_40;
  ushort local_32 [4];
  PropertyIndex index;
  
  pPStack_50 = info;
  BVar5 = GetDescriptor(this,propertyId,local_32);
  if (BVar5 == 0) {
    BVar5 = ScriptContext::IsNumericPropertyId
                      ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr,propertyId,&local_54);
    if (BVar5 == 0) {
      BVar5 = AddProperty(this,instance,propertyId,value,attributes,pPStack_50,flags,
                          possibleSideEffects);
    }
    else {
      BVar5 = DynamicTypeHandler::SetItemWithAttributes
                        (&this->super_DynamicTypeHandler,instance,local_54,value,attributes);
    }
  }
  else {
    local_60 = this->descriptors;
    if (this->descriptors[local_32[0]].field_1.Attributes != attributes) {
      pSVar8 = this;
      if (((this->super_DynamicTypeHandler).flags & 4) != 0) {
        local_40 = (SimpleTypeHandler<6UL> *)(instance->super_RecyclableObject).type.ptr;
        bVar4 = DoConvertToPathType((DynamicType *)local_40);
        if (bVar4) {
          pPVar7 = ConvertToPathType(this,instance);
          iVar6 = (*(pPVar7->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3a])
                            (pPVar7,instance,(ulong)(uint)propertyId,value,(ulong)attributes,
                             pPStack_50,(ulong)flags,(ulong)possibleSideEffects);
          return iVar6;
        }
        pSVar8 = ConvertToNonSharedSimpleType(this,instance);
        if ((*(Type *)((long)local_40 + 0x30) == true) &&
           ((SimpleTypeHandler<6UL> *)(instance->super_RecyclableObject).type.ptr == local_40)) {
          AssertCount = AssertCount + 1;
          local_40 = pSVar8;
          Throw::LogAssert();
          local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *local_48 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                      ,0x3fb,
                                      "(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType)"
                                      ,
                                      "!oldType->GetIsLocked() || instance->GetDynamicType() != oldType"
                                     );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *local_48 = 0;
          pSVar8 = local_40;
        }
      }
      local_40 = pSVar8;
      if ((local_60[local_32[0]].field_1.Attributes & 8) != 0) {
        ScriptContext::InvalidateProtoCaches
                  ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
      }
      local_40->descriptors[local_32[0]].field_1.Attributes = attributes;
      local_48 = (undefined4 *)value;
      if ((attributes & 1) != 0) {
        DynamicObject::SetHasNoEnumerableProperties(instance,false);
      }
      pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
      Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
      WriteBarrierSet(&local_68,&pJVar2->typesWithOnlyWritablePropertyProtoChain);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                (local_68.ptr,&local_40->super_DynamicTypeHandler,attributes,propertyId,
                 (pJVar2->super_JavascriptLibraryBase).scriptContext.ptr);
      value = local_48;
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,(uint)local_32[0],value);
    if (pPStack_50 != (PropertyValueInfo *)0x0) {
      TVar1 = local_60[local_32[0]].field_1.Attributes;
      pPStack_50->m_instance = &instance->super_RecyclableObject;
      pPStack_50->m_propertyIndex = local_32[0];
      pPStack_50->m_attributes = TVar1;
      pPStack_50->flags = InlineCacheNoFlags;
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,instance,propertyId,value,possibleSideEffects);
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes != attributes)
            {
                SimpleTypeHandler * typeHandler = this;
                if (GetIsLocked())
                {
                    DynamicType* oldType = instance->GetDynamicType();
                    if (DoConvertToPathType(oldType))
                    {
                        return this->ConvertToPathType(instance)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }
                    else
                    {
                        // Don't attempt to share cross-site function types
                        typeHandler = this->ConvertToNonSharedSimpleType(instance);
                    }
                    Assert(!oldType->GetIsLocked() || instance->GetDynamicType() != oldType);
                }
                if (descriptors[index].Attributes & PropertyDeleted)
                {
                    instance->GetScriptContext()->InvalidateProtoCaches(propertyId);
                }
                typeHandler->descriptors[index].Attributes = attributes;
                if (attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, attributes, propertyId, library->GetScriptContext());
            }
            SetSlotUnchecked(instance, index, value);
            PropertyValueInfo::Set(info, instance, static_cast<PropertyIndex>(index), descriptors[index].Attributes);
            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. May create objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::SetItemWithAttributes(instance, indexVal, value, attributes);
        }

        return this->AddProperty(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
    }